

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O3

void ValueArgumentExtracterStream(string *argument,int value_start_position,double *value)

{
  double a;
  string temp_argument;
  exception e;
  double local_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  stringstream local_198 [128];
  ios_base local_118 [264];
  
  std::__cxx11::string::substr((ulong)local_1b8,(ulong)argument);
  std::__cxx11::stringstream::stringstream(local_198,(string *)local_1b8,_S_out|_S_in);
  std::istream::_M_extract<double>((double *)local_198);
  *value = local_1c0;
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  return;
}

Assistant:

void ValueArgumentExtracterStream(const string &argument, int value_start_position, double &value)
{
  try{
    string temp_argument = argument.substr(value_start_position, argument.length() - value_start_position);
    stringstream temp_stream(temp_argument);
    double a;
    temp_stream >> a;
    value = a;
  }
  catch (exception e)
  {
    return;
  }
}